

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagonal.h
# Opt level: O0

Index __thiscall
Eigen::Diagonal<Eigen::Matrix<float,_16,_16,_1,_16,_16>,_0>::rows
          (Diagonal<Eigen::Matrix<float,_16,_16,_1,_16,_16>,_0> *this)

{
  long lVar1;
  Index IVar2;
  long *plVar3;
  long local_60;
  Diagonal<Eigen::Matrix<float,_16,_16,_1,_16,_16>,_0> local_50;
  long local_40;
  Index local_38;
  Diagonal<Eigen::Matrix<float,_16,_16,_1,_16,_16>,_0> *local_30;
  Diagonal<Eigen::Matrix<float,_16,_16,_1,_16,_16>,_0> *this_local;
  undefined1 *local_20;
  long *local_18;
  long *local_10;
  
  local_30 = this;
  lVar1 = internal::variable_if_dynamicindex<long,_0>::value();
  if (lVar1 < 0) {
    local_38 = PlainObjectBase<Eigen::Matrix<float,_16,_16,_1,_16,_16>_>::cols
                         (&this->m_matrix->
                           super_PlainObjectBase<Eigen::Matrix<float,_16,_16,_1,_16,_16>_>);
    IVar2 = PlainObjectBase<Eigen::Matrix<float,_16,_16,_1,_16,_16>_>::rows
                      (&this->m_matrix->
                        super_PlainObjectBase<Eigen::Matrix<float,_16,_16,_1,_16,_16>_>);
    local_40 = internal::variable_if_dynamicindex<long,_0>::value();
    local_40 = IVar2 + local_40;
    local_10 = &local_38;
    local_18 = &local_40;
    plVar3 = std::min<long>(local_10,local_18);
    local_60 = *plVar3;
  }
  else {
    local_50._8_8_ =
         PlainObjectBase<Eigen::Matrix<float,_16,_16,_1,_16,_16>_>::rows
                   (&this->m_matrix->super_PlainObjectBase<Eigen::Matrix<float,_16,_16,_1,_16,_16>_>
                   );
    IVar2 = PlainObjectBase<Eigen::Matrix<float,_16,_16,_1,_16,_16>_>::cols
                      (&this->m_matrix->
                        super_PlainObjectBase<Eigen::Matrix<float,_16,_16,_1,_16,_16>_>);
    lVar1 = internal::variable_if_dynamicindex<long,_0>::value();
    local_50.m_matrix = (non_const_type)(IVar2 - lVar1);
    local_20 = &local_50.field_0x8;
    this_local = &local_50;
    plVar3 = std::min<long>((long *)local_20,(long *)this_local);
    local_60 = *plVar3;
  }
  return local_60;
}

Assistant:

EIGEN_DEVICE_FUNC
    inline Index rows() const
    {
      return m_index.value()<0 ? numext::mini<Index>(m_matrix.cols(),m_matrix.rows()+m_index.value())
                               : numext::mini<Index>(m_matrix.rows(),m_matrix.cols()-m_index.value());
    }